

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

Type * slang::ast::getIndexedType
                 (Compilation *compilation,ASTContext *context,Type *valueType,SourceRange exprRange
                 ,SourceRange valueRange,bool isRangeSelect)

{
  SourceLocation SVar1;
  bool bVar2;
  Type *pTVar3;
  Diagnostic *pDVar4;
  Type *pTVar5;
  undefined7 in_register_00000089;
  SourceRange range;
  SourceRange range_00;
  
  SVar1._1_7_ = in_register_00000089;
  SVar1._0_1_ = isRangeSelect;
  pTVar3 = valueType->canonical;
  if (pTVar3 == (Type *)0x0) {
    Type::resolveCanonical(valueType);
    pTVar3 = valueType->canonical;
  }
  bVar2 = Type::isArray(pTVar3);
  if (bVar2) {
    pTVar3 = Type::getArrayElementType(pTVar3);
    if (((valueType->super_Symbol).kind == PackedArrayType) &&
       (bVar2 = Type::isSigned(valueType), bVar2)) {
      pTVar3 = Type::makeUnsigned(pTVar3,compilation);
      return pTVar3;
    }
  }
  else if ((pTVar3->super_Symbol).kind == StringType && valueRange.endLoc._0_1_ == '\0') {
    pTVar3 = compilation->byteType;
  }
  else {
    bVar2 = Type::isIntegral(pTVar3);
    pTVar5 = pTVar3->canonical;
    if (bVar2) {
      if (pTVar5 == (Type *)0x0) {
        Type::resolveCanonical(pTVar3);
        pTVar5 = pTVar3->canonical;
      }
      if ((pTVar5->super_Symbol).kind != ScalarType) {
        bVar2 = Type::isFourState(pTVar3);
        if (bVar2) {
          return compilation->logicType;
        }
        return compilation->bitType;
      }
      pDVar4 = ASTContext::addDiag(context,(DiagCode)0x370007,exprRange);
      range.endLoc = valueRange.startLoc;
      range.startLoc = SVar1;
      Diagnostic::operator<<(pDVar4,range);
    }
    else {
      if (pTVar5 == (Type *)0x0) {
        Type::resolveCanonical(pTVar3);
        pTVar5 = pTVar3->canonical;
      }
      if ((pTVar5->super_Symbol).kind != ErrorType) {
        pDVar4 = ASTContext::addDiag(context,(DiagCode)
                                             ((uint)(byte)valueRange.endLoc._0_1_ * 0x40000 +
                                             0x240007),exprRange);
        range_00.endLoc = valueRange.startLoc;
        range_00.startLoc = SVar1;
        Diagnostic::operator<<(pDVar4,range_00);
        operator<<(pDVar4,valueType);
      }
    }
    pTVar3 = compilation->errorType;
  }
  return pTVar3;
}

Assistant:

static const Type& getIndexedType(Compilation& compilation, const ASTContext& context,
                                  const Type& valueType, SourceRange exprRange,
                                  SourceRange valueRange, bool isRangeSelect) {
    const Type& ct = valueType.getCanonicalType();
    if (ct.isArray()) {
        auto& elemType = *ct.getArrayElementType();
        if (valueType.kind == SymbolKind::PackedArrayType && valueType.isSigned())
            return elemType.makeUnsigned(compilation);

        return elemType;
    }
    else if (ct.kind == SymbolKind::StringType && !isRangeSelect) {
        return compilation.getByteType();
    }
    else if (!ct.isIntegral()) {
        if (!ct.isError()) {
            auto code = isRangeSelect ? diag::BadSliceType : diag::BadIndexExpression;
            auto& diag = context.addDiag(code, exprRange);
            diag << valueRange;
            diag << valueType;
        }
        return compilation.getErrorType();
    }
    else if (ct.isScalar()) {
        auto& diag = context.addDiag(diag::CannotIndexScalar, exprRange);
        diag << valueRange;
        return compilation.getErrorType();
    }
    else if (ct.isFourState()) {
        return compilation.getLogicType();
    }
    else {
        return compilation.getBitType();
    }
}